

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar4;
  uchar *ptr_5;
  int j_1;
  Mat m_3;
  uchar *outptr_5;
  int p_1;
  Mat *top_blob_5;
  int slice_5;
  size_t i_5;
  int q_5;
  int channels_2;
  int h_4;
  int w_5;
  uchar *ptr_4;
  uchar *outptr_4;
  int size_2;
  int p;
  Mat *top_blob_4;
  int slice_4;
  size_t i_4;
  int q_4;
  int channels_1;
  int h_3;
  int w_4;
  uchar *outptr_3;
  uchar *ptr_3;
  int size_1;
  Mat *top_blob_3;
  int slice_3;
  size_t i_3;
  int q_3;
  int channels;
  int h_2;
  int w_3;
  uchar *ptr_2;
  uchar *outptr_2;
  int j;
  Mat *top_blob_2;
  int slice_2;
  size_t i_2;
  int q_2;
  int h_1;
  int w_2;
  uchar *outptr_1;
  uchar *ptr_1;
  int size;
  Mat *top_blob_1;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  uchar *outptr;
  uchar *ptr;
  Mat *top_blob;
  int slice;
  size_t i;
  int q;
  int w;
  int positive_axis;
  int *slices_ptr;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *m_5;
  Mat *m_2;
  Mat *m;
  Mat *m_4;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff688;
  Allocator *in_stack_fffffffffffff690;
  const_reference in_stack_fffffffffffff698;
  Mat *in_stack_fffffffffffff6a0;
  void *in_stack_fffffffffffff6a8;
  Mat *in_stack_fffffffffffff6b0;
  int local_7fc;
  int local_7e4;
  Allocator local_7e0;
  int *local_7d8;
  ulong local_7d0;
  int local_7c8;
  Allocator *local_7c0;
  int local_7b8;
  int local_7b4;
  int local_7b0;
  undefined4 local_7ac;
  int local_7a8;
  ulong local_7a0;
  Mat local_798;
  void *local_750;
  int local_744;
  reference local_740;
  int local_734;
  ulong local_730;
  int local_728;
  int local_724;
  int local_720;
  int local_71c;
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined4 local_700;
  Allocator *local_6f8;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 local_6e0;
  undefined8 local_6d8;
  void *local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  undefined4 local_6b0;
  Allocator *local_6a8;
  undefined4 local_6a0;
  undefined4 local_69c;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined8 local_688;
  void *local_680;
  int local_678;
  int local_674;
  reference local_670;
  int local_664;
  ulong local_660;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  void *local_648;
  undefined8 local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined4 local_618;
  Allocator *local_610;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined8 local_5f0;
  void *local_5e8;
  int local_5dc;
  reference local_5d8;
  int local_5cc;
  ulong local_5c8;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  void *local_5b0;
  void *local_5a8;
  int local_59c;
  reference local_598;
  int local_58c;
  ulong local_588;
  int local_57c;
  int local_578;
  int local_574;
  void *local_570;
  void *local_568;
  int local_55c;
  reference local_558;
  int local_54c;
  ulong local_548;
  int local_53c;
  int local_538;
  int local_534;
  void *local_530;
  void *local_528;
  reference local_520;
  int local_514;
  ulong local_510;
  int local_504;
  int local_500;
  int local_4fc;
  long local_4f8;
  size_t local_4f0;
  undefined4 local_4e4;
  const_reference local_4e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_4d0;
  undefined8 *local_4b0;
  undefined8 *local_4a0;
  undefined8 *local_490;
  Mat *local_480;
  Allocator *local_470;
  long *local_460;
  reference local_458;
  reference local_450;
  reference local_448;
  reference local_440;
  reference local_438;
  reference local_430;
  undefined8 *local_428;
  const_reference local_420;
  Mat *local_418;
  undefined8 *local_410;
  reference local_408;
  reference local_400;
  reference local_3f8;
  int local_3ec;
  Allocator *local_3e8;
  int local_3dc;
  undefined8 *local_3d8;
  int local_3cc;
  const_reference local_3c8;
  int local_3bc;
  const_reference local_3b8;
  int local_3ac;
  reference local_3a8;
  undefined1 local_39d;
  int local_39c;
  const_reference local_398;
  Allocator *local_390;
  undefined1 local_37d;
  int local_37c;
  const_reference local_378;
  undefined8 *local_370;
  undefined1 local_35d;
  int local_35c;
  const_reference local_358;
  undefined8 *local_350;
  undefined1 local_33d;
  int local_33c;
  reference local_338;
  Mat *local_330;
  undefined1 local_31d;
  int local_31c;
  reference local_318;
  undefined8 *local_310;
  int local_2a0;
  undefined4 local_29c;
  Allocator *local_298;
  Mat *local_278;
  undefined8 *local_258;
  undefined8 *local_238;
  undefined8 *local_218;
  _func_int **local_1d0;
  reference local_198;
  reference local_190;
  reference local_188;
  reference local_180;
  reference local_178;
  reference local_170;
  Allocator *local_168;
  int local_15c;
  size_t local_158;
  void *local_150;
  int local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  Allocator *local_130;
  int local_124;
  size_t local_120;
  void *local_118;
  int local_10c;
  int local_108;
  int local_104;
  Mat *local_100;
  Allocator *local_f8;
  int local_ec;
  size_t local_e8;
  void *local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  Allocator *local_c0;
  int local_b4;
  size_t local_b0;
  void *local_a8;
  int local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  Allocator *local_88;
  int local_7c;
  ulong local_78;
  _func_int **local_70;
  int local_64;
  int local_60;
  int local_5c;
  Allocator *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_4d0 = in_RDX;
  local_4e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar2 = local_4e0->dims;
  local_4f0 = local_4e0->elemsize;
  local_460 = (long *)(in_RDI + 0xd0);
  local_4f8 = *local_460;
  if (*(int *)(in_RDI + 0x118) < 0) {
    local_7fc = iVar2 + *(int *)(in_RDI + 0x118);
  }
  else {
    local_7fc = *(int *)(in_RDI + 0x118);
  }
  local_4fc = local_7fc;
  if (iVar2 == 1) {
    local_500 = local_4e0->w;
    local_504 = 0;
    local_4e4 = 1;
    for (local_510 = 0; uVar1 = local_510,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0), uVar1 < sVar3;
        local_510 = local_510 + 1) {
      local_514 = *(int *)(local_4f8 + local_510 * 4);
      if (local_514 == -0xe9) {
        iVar2 = local_500 - local_504;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0);
        local_514 = (int)((ulong)(long)iVar2 / (sVar3 - local_510));
      }
      local_520 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4d0,local_510);
      Mat::create(in_stack_fffffffffffff6a0,(int)((ulong)in_stack_fffffffffffff698 >> 0x20),
                  (size_t)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
      local_430 = local_520;
      bVar4 = true;
      if (local_520->data != (void *)0x0) {
        local_198 = local_520;
        bVar4 = local_520->cstep * (long)local_520->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      local_420 = local_4e0;
      local_528 = (void *)((long)local_4e0->data + (long)local_504 * local_4f0);
      local_3f8 = local_520;
      local_530 = local_520->data;
      memcpy(local_530,local_528,(long)local_514 * local_4f0);
      local_504 = local_514 + local_504;
    }
  }
  else if ((iVar2 == 2) && (local_7fc == 0)) {
    local_534 = local_4e0->w;
    local_538 = local_4e0->h;
    local_53c = 0;
    local_4e4 = 2;
    for (local_548 = 0; uVar1 = local_548,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0), uVar1 < sVar3;
        local_548 = local_548 + 1) {
      local_54c = *(int *)(local_4f8 + local_548 * 4);
      if (local_54c == -0xe9) {
        iVar2 = local_538 - local_53c;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0);
        local_54c = (int)((ulong)(long)iVar2 / (sVar3 - local_548));
      }
      local_558 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4d0,local_548);
      Mat::create(in_stack_fffffffffffff6a0,(int)((ulong)in_stack_fffffffffffff698 >> 0x20),
                  (int)in_stack_fffffffffffff698,(size_t)in_stack_fffffffffffff690,
                  in_stack_fffffffffffff688);
      local_438 = local_558;
      bVar4 = true;
      if (local_558->data != (void *)0x0) {
        local_190 = local_558;
        bVar4 = local_558->cstep * (long)local_558->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      local_55c = local_534 * local_54c;
      local_3b8 = local_4e0;
      local_3bc = local_53c;
      local_568 = (void *)((long)local_4e0->data +
                          (long)local_4e0->w * (long)local_53c * local_4e0->elemsize);
      local_400 = local_558;
      local_570 = local_558->data;
      memcpy(local_570,local_568,(long)local_55c * local_4f0);
      local_53c = local_54c + local_53c;
    }
  }
  else if ((iVar2 == 2) && (local_7fc == 1)) {
    local_574 = local_4e0->w;
    local_578 = local_4e0->h;
    local_57c = 0;
    local_4e4 = 2;
    for (local_588 = 0; uVar1 = local_588,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0), uVar1 < sVar3;
        local_588 = local_588 + 1) {
      local_58c = *(int *)(local_4f8 + local_588 * 4);
      if (local_58c == -0xe9) {
        iVar2 = local_574 - local_57c;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0);
        local_58c = (int)((ulong)(long)iVar2 / (sVar3 - local_588));
      }
      local_598 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4d0,local_588);
      Mat::create(in_stack_fffffffffffff6a0,(int)((ulong)in_stack_fffffffffffff698 >> 0x20),
                  (int)in_stack_fffffffffffff698,(size_t)in_stack_fffffffffffff690,
                  in_stack_fffffffffffff688);
      local_440 = local_598;
      bVar4 = true;
      if (local_598->data != (void *)0x0) {
        local_188 = local_598;
        bVar4 = local_598->cstep * (long)local_598->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      for (local_59c = 0; local_59c < local_578; local_59c = local_59c + 1) {
        local_3a8 = local_598;
        local_3ac = local_59c;
        local_5a8 = (void *)((long)local_598->data +
                            (long)local_598->w * (long)local_59c * local_598->elemsize);
        local_3c8 = local_4e0;
        local_3cc = local_59c;
        local_5b0 = (void *)((long)local_4e0->data +
                            (long)local_57c * local_4f0 +
                            (long)local_4e0->w * (long)local_59c * local_4e0->elemsize);
        memcpy(local_5a8,local_5b0,(long)local_58c * local_4f0);
      }
      local_57c = local_58c + local_57c;
    }
  }
  else if ((iVar2 == 3) && (local_7fc == 0)) {
    local_5b4 = local_4e0->w;
    local_5b8 = local_4e0->h;
    local_5bc = local_4e0->c;
    local_5c0 = 0;
    local_4e4 = 3;
    for (local_5c8 = 0; uVar1 = local_5c8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0), uVar1 < sVar3;
        local_5c8 = local_5c8 + 1) {
      local_5cc = *(int *)(local_4f8 + local_5c8 * 4);
      if (local_5cc == -0xe9) {
        iVar2 = local_5bc - local_5c0;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0);
        local_5cc = (int)((ulong)(long)iVar2 / (sVar3 - local_5c8));
      }
      local_5d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4d0,local_5c8);
      Mat::create(in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
                  (int)in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                  (size_t)in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      bVar4 = true;
      if (local_5d8->data != (void *)0x0) {
        local_180 = local_5d8;
        bVar4 = local_5d8->cstep * (long)local_5d8->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      local_5dc = (int)local_4e0->cstep * local_5cc;
      local_350 = &local_630;
      local_cc = local_4e0->w;
      local_d0 = local_4e0->h;
      local_d4 = local_4e0->d;
      local_5e8 = (void *)((long)local_4e0->data +
                          local_4e0->cstep * (long)local_5c0 * local_4e0->elemsize);
      local_e8 = local_4e0->elemsize;
      local_ec = local_4e0->elempack;
      local_f8 = local_4e0->allocator;
      local_c8 = &local_630;
      local_28 = (long)local_cc * (long)local_d0 * local_e8;
      local_428 = &local_630;
      local_4b0 = &local_630;
      local_2c = 0x10;
      local_358 = local_4e0;
      local_35c = local_5c0;
      local_35d = 1;
      local_448 = local_5d8;
      local_630 = 0;
      local_620 = 0;
      local_618 = 0;
      local_608 = 0;
      local_604 = 0;
      local_600 = 0;
      local_5fc = 0;
      local_5f8 = 0;
      local_5f0 = 0;
      local_628 = 0;
      local_408 = local_5d8;
      local_648 = local_5d8->data;
      local_218 = local_4b0;
      local_e0 = local_5e8;
      local_610 = local_f8;
      memcpy(local_648,local_5e8,(long)local_5dc * local_4f0);
      local_5c0 = local_5cc + local_5c0;
    }
  }
  else if ((iVar2 == 3) && (local_7fc == 1)) {
    local_64c = local_4e0->w;
    local_650 = local_4e0->h;
    local_654 = local_4e0->c;
    local_658 = 0;
    local_4e4 = 3;
    for (local_660 = 0; uVar1 = local_660,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0), uVar1 < sVar3;
        local_660 = local_660 + 1) {
      local_664 = *(int *)(local_4f8 + local_660 * 4);
      if (local_664 == -0xe9) {
        iVar2 = local_650 - local_658;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0);
        local_664 = (int)((ulong)(long)iVar2 / (sVar3 - local_660));
      }
      local_670 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4d0,local_660);
      Mat::create(in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
                  (int)in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                  (size_t)in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      local_450 = local_670;
      bVar4 = true;
      if (local_670->data != (void *)0x0) {
        local_178 = local_670;
        bVar4 = local_670->cstep * (long)local_670->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      for (local_674 = 0; local_674 < local_654; local_674 = local_674 + 1) {
        local_678 = local_64c * local_664;
        local_310 = &local_6c8;
        local_13c = local_670->w;
        local_140 = local_670->h;
        local_144 = local_670->d;
        local_680 = (void *)((long)local_670->data +
                            local_670->cstep * (long)local_674 * local_670->elemsize);
        local_158 = local_670->elemsize;
        local_15c = local_670->elempack;
        local_168 = local_670->allocator;
        local_138 = &local_6c8;
        local_8 = (long)local_13c * (long)local_140 * local_158;
        local_410 = &local_6c8;
        local_4a0 = &local_6c8;
        local_370 = &local_718;
        local_94 = local_4e0->w;
        local_98 = local_4e0->h;
        local_9c = local_4e0->d;
        local_a8 = (void *)((long)local_4e0->data +
                           local_4e0->cstep * (long)local_674 * local_4e0->elemsize);
        local_b0 = local_4e0->elemsize;
        local_b4 = local_4e0->elempack;
        local_c0 = local_4e0->allocator;
        local_90 = &local_718;
        local_38 = (long)local_94 * (long)local_98 * local_b0;
        local_3d8 = &local_718;
        local_6d0 = (void *)((long)local_a8 + (long)local_94 * (long)local_658 * local_b0);
        local_490 = &local_718;
        local_690 = 0;
        local_694 = 0;
        local_698 = 0;
        local_69c = 0;
        local_6b0 = 0;
        local_6b8 = 0;
        local_6c0 = 0;
        local_6c8 = 0;
        local_c = 0x10;
        local_3c = 0x10;
        local_318 = local_670;
        local_31c = local_674;
        local_31d = 1;
        local_378 = local_4e0;
        local_37c = local_674;
        local_37d = 1;
        local_3dc = local_658;
        local_688 = 0;
        local_6a0 = 0;
        local_718 = 0;
        local_708 = 0;
        local_700 = 0;
        local_6f0 = 0;
        local_6ec = 0;
        local_6e8 = 0;
        local_6e4 = 0;
        local_6e0 = 0;
        local_6d8 = 0;
        local_710 = 0;
        local_258 = local_490;
        local_238 = local_4a0;
        local_150 = local_680;
        local_6f8 = local_c0;
        local_6a8 = local_168;
        memcpy(local_680,local_6d0,(long)local_678 * local_4f0);
      }
      local_658 = local_664 + local_658;
    }
  }
  else if ((iVar2 == 3) && (local_7fc == 2)) {
    local_71c = local_4e0->w;
    local_720 = local_4e0->h;
    local_724 = local_4e0->c;
    local_728 = 0;
    local_4e4 = 3;
    for (local_730 = 0; uVar1 = local_730,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0), uVar1 < sVar3;
        local_730 = local_730 + 1) {
      local_734 = *(int *)(local_4f8 + local_730 * 4);
      if (local_734 == -0xe9) {
        iVar2 = local_71c - local_728;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4d0);
        local_734 = (int)((ulong)(long)iVar2 / (sVar3 - local_730));
      }
      local_740 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_4d0,local_730);
      Mat::create(in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
                  (int)in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                  (size_t)in_stack_fffffffffffff698,in_stack_fffffffffffff690);
      local_458 = local_740;
      bVar4 = true;
      if (local_740->data != (void *)0x0) {
        local_170 = local_740;
        bVar4 = local_740->cstep * (long)local_740->c == 0;
      }
      if (bVar4) {
        return -100;
      }
      for (local_744 = 0; local_744 < local_724; local_744 = local_744 + 1) {
        local_330 = &local_798;
        local_104 = local_740->w;
        local_108 = local_740->h;
        local_10c = local_740->d;
        in_stack_fffffffffffff6a8 =
             (void *)((long)local_740->data +
                     local_740->cstep * (long)local_744 * local_740->elemsize);
        local_120 = local_740->elemsize;
        local_124 = local_740->elempack;
        local_130 = local_740->allocator;
        local_100 = &local_798;
        local_18 = (long)local_104 * (long)local_108 * local_120;
        local_418 = &local_798;
        in_stack_fffffffffffff6a0 = &local_798;
        local_1c = 0x10;
        local_338 = local_740;
        local_33c = local_744;
        local_33d = 1;
        local_798.data = (void *)0x0;
        local_798.elemsize = 0;
        local_798.elempack = 0;
        local_798.dims = 0;
        local_798.w = 0;
        local_798.h = 0;
        local_798.d = 0;
        local_798.c = 0;
        local_798.cstep = 0;
        local_798.refcount = (int *)0x0;
        local_390 = &local_7e0;
        local_5c = local_4e0->w;
        local_60 = local_4e0->h;
        local_64 = local_4e0->d;
        local_70 = (_func_int **)
                   ((long)local_4e0->data + local_4e0->cstep * (long)local_744 * local_4e0->elemsize
                   );
        local_78 = local_4e0->elemsize;
        local_7c = local_4e0->elempack;
        local_88 = local_4e0->allocator;
        in_stack_fffffffffffff690 = &local_7e0;
        local_7d8 = (int *)0x0;
        local_7ac = 1;
        local_48 = (long)local_5c * (long)local_60 * local_78;
        local_7a0 = (local_48 + 0xfU & 0xfffffffffffffff0) / local_78;
        local_7b8 = local_4e0->dims + -1;
        if (local_4e0->dims == 4) {
          local_7a0 = (long)local_4e0->w * (long)local_4e0->h;
        }
        local_4c = 0x10;
        local_398 = local_4e0;
        local_39c = local_744;
        local_39d = 1;
        in_stack_fffffffffffff698 = local_4e0;
        local_750 = in_stack_fffffffffffff6a8;
        local_480 = in_stack_fffffffffffff6a0;
        local_278 = in_stack_fffffffffffff6a0;
        local_118 = in_stack_fffffffffffff6a8;
        local_58 = in_stack_fffffffffffff690;
        local_7e0._vptr_Allocator = local_70;
        local_7d0 = local_78;
        local_7c8 = local_7c;
        local_7c0 = local_88;
        local_7b4 = local_5c;
        local_7b0 = local_60;
        local_7a8 = local_64;
        local_798.allocator = local_130;
        for (local_7e4 = 0; local_7e4 < local_720; local_7e4 = local_7e4 + 1) {
          local_3e8 = &local_7e0;
          local_3ec = local_7e4;
          memcpy(local_750,
                 (void *)((long)local_7e0._vptr_Allocator +
                         (long)local_728 * local_4f0 + (long)local_7b4 * (long)local_7e4 * local_7d0
                         ),(long)local_734 * local_4f0);
          local_750 = (void *)((long)local_734 * local_4f0 + (long)local_750);
        }
        local_470 = &local_7e0;
        local_298 = local_470;
        if (local_7d8 != (int *)0x0) {
          local_29c = 0xffffffff;
          LOCK();
          local_2a0 = *local_7d8;
          *local_7d8 = *local_7d8 + -1;
          UNLOCK();
          if (local_2a0 == 1) {
            if (local_7c0 == (Allocator *)0x0) {
              local_1d0 = local_7e0._vptr_Allocator;
              if (local_7e0._vptr_Allocator != (_func_int **)0x0) {
                free(local_7e0._vptr_Allocator);
              }
            }
            else {
              (*local_7c0->_vptr_Allocator[3])(local_7c0,local_7e0._vptr_Allocator);
            }
          }
        }
        local_7e0._vptr_Allocator = (_func_int **)0x0;
        local_7d0 = 0;
        local_7c8 = 0;
        local_7b8 = 0;
        local_7b4 = 0;
        local_7b0 = 0;
        local_7ac = 0;
        local_7a8 = 0;
        local_7a0 = 0;
        local_7d8 = (int *)0x0;
      }
      local_728 = local_734 + local_728;
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}